

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool SearchAndAddSourceFile(char **buf,char *name)

{
  bool bVar1;
  bool bVar2;
  char tmp [256];
  char acStack_128 [264];
  
  format(acStack_128,0x100,"%s",name);
  bVar1 = AddSourceFile(buf,acStack_128);
  bVar2 = true;
  if (!bVar1) {
    format(acStack_128,0x100,"translation/%s",name);
    bVar1 = AddSourceFile(buf,acStack_128);
    if (!bVar1) {
      format(acStack_128,0x100,"NULLC/translation/%s",name);
      bVar1 = AddSourceFile(buf,acStack_128);
      if (!bVar1) {
        format(acStack_128,0x100,"../NULLC/translation/%s",name);
        bVar2 = AddSourceFile(buf,acStack_128);
      }
    }
  }
  return bVar2;
}

Assistant:

bool SearchAndAddSourceFile(char*& buf, const char* name)
{
	const unsigned tmpSize = 256;
	char tmp[tmpSize];
	format(tmp, tmpSize, "%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "NULLC/translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	format(tmp, tmpSize, "../NULLC/translation/%s", name);

	if(AddSourceFile(buf, tmp))
		return true;

	return false;
}